

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::Dynamic_Proxy_Function::operator==
          (Dynamic_Proxy_Function *this,Proxy_Function_Base *rhs)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *__first1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
  *__last1;
  bool bVar1;
  long lVar2;
  
  lVar2 = __dynamic_cast(rhs,&Proxy_Function_Base::typeinfo,&typeinfo,0);
  if (this == (Dynamic_Proxy_Function *)rhs) {
    bVar1 = true;
  }
  else {
    if (lVar2 != 0) {
      if ((this->super_Proxy_Function_Base).m_arity != *(int *)(lVar2 + 0x20)) {
        return false;
      }
      if ((this->m_guard).
          super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        return false;
      }
      if (*(long *)(lVar2 + 0x60) == 0) {
        __first1 = (this->m_param_types).m_types.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        __last1 = (this->m_param_types).m_types.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((long)__last1 - (long)__first1 ==
            *(long *)(lVar2 + 0x30) -
            (long)*(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                    **)(lVar2 + 0x28)) {
          bVar1 = std::__equal<false>::
                  equal<std::pair<std::__cxx11::string,chaiscript::Type_Info>const*,std::pair<std::__cxx11::string,chaiscript::Type_Info>const*>
                            (__first1,__last1,
                             *(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>
                               **)(lVar2 + 0x28));
          return bVar1;
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool operator==(const Proxy_Function_Base &rhs) const CHAISCRIPT_OVERRIDE
        {
          const Dynamic_Proxy_Function *prhs = dynamic_cast<const Dynamic_Proxy_Function *>(&rhs);

          return this == &rhs
            || (prhs
                && this->m_arity == prhs->m_arity
                && !this->m_guard && !prhs->m_guard
                && this->m_param_types == prhs->m_param_types);
        }